

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QChar_&,_const_QString_&>,_QChar_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QChar_&,_const_QString_&>,_QChar_&> *this)

{
  QString *pQVar1;
  long lVar2;
  char16_t *__src;
  char16_t *pcVar3;
  
  pQVar1 = (this->a).b;
  if (((((this->a).a)->ucs == L'\0') && ((pQVar1->d).ptr == (char16_t *)0x0)) &&
     (this->b->ucs == L'\0')) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar2 = (pQVar1->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar2 + 2,Uninitialized);
    pcVar3 = (__return_storage_ptr__->d).ptr;
    *pcVar3 = ((this->a).a)->ucs;
    pcVar3 = pcVar3 + 1;
    pQVar1 = (this->a).b;
    lVar2 = (pQVar1->d).size;
    if (lVar2 != 0) {
      __src = (pQVar1->d).ptr;
      if (__src == (char16_t *)0x0) {
        __src = (char16_t *)&QString::_empty;
      }
      memcpy(pcVar3,__src,lVar2 * 2);
    }
    pcVar3[lVar2] = this->b->ucs;
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }